

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kcpu.h
# Opt level: O0

void m68ki_exception_bus_error(void)

{
  uint sr_00;
  int local_c;
  uint sr;
  int i;
  
  if (m68ki_cpu.run_mode == 1) {
    m68k_read_memory_8(0xffff01);
    m68ki_cpu.stopped = 2;
    return;
  }
  m68ki_cpu.run_mode = 1;
  m68ki_remaining_cycles =
       m68ki_remaining_cycles -
       ((uint)m68ki_cpu.cyc_exception[2] - (uint)m68ki_cpu.cyc_instruction[m68ki_cpu.ir]);
  for (local_c = 0xf; -1 < local_c; local_c = local_c + -1) {
    m68ki_cpu.dar[local_c] = m68ki_cpu.dar_save[local_c];
  }
  sr_00 = m68ki_init_exception();
  m68ki_stack_frame_1000(m68ki_cpu.ppc,sr_00,2);
  m68ki_jump_vector(2);
  m68ki_cpu.run_mode = 2;
  longjmp((__jmp_buf_tag *)m68ki_bus_error_jmp_buf,1);
}

Assistant:

static inline void m68ki_exception_bus_error(void)
{
	int i;

	/* If we were processing a bus error, address error, or reset,
	 * while writing the stack frame, this is a catastrophic failure.
	 * Halt the CPU
	 */
	if(CPU_RUN_MODE == RUN_MODE_BERR_AERR_RESET_WSF)
	{
		m68k_read_memory_8(0x00ffff01);
		CPU_STOPPED = STOP_LEVEL_HALT;
		return;
	}
	CPU_RUN_MODE = RUN_MODE_BERR_AERR_RESET_WSF;

	/* Use up some clock cycles and undo the instruction's cycles */
	USE_CYCLES(CYC_EXCEPTION[EXCEPTION_BUS_ERROR] - CYC_INSTRUCTION[REG_IR]);

	for (i = 15; i >= 0; i--){
		REG_DA[i] = REG_DA_SAVE[i];
	}

	uint sr = m68ki_init_exception();

	/* Note: This is implemented for 68010 only! */
	m68ki_stack_frame_1000(REG_PPC, sr, EXCEPTION_BUS_ERROR);

	m68ki_jump_vector(EXCEPTION_BUS_ERROR);

	CPU_RUN_MODE = RUN_MODE_BERR_AERR_RESET;

	longjmp(m68ki_bus_error_jmp_buf, 1);
}